

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O2

string * __thiscall
slang::ast::GenerateBlockArraySymbol::getExternalName_abi_cxx11_
          (string *__return_storage_ptr__,GenerateBlockArraySymbol *this)

{
  Scope *in_RCX;
  allocator<char> local_9;
  
  if ((this->super_Symbol).name._M_len == 0) {
    createGenBlkName_abi_cxx11_
              (__return_storage_ptr__,(ast *)(ulong)this->constructIndex,
               (uint32_t)(this->super_Symbol).parentScope,in_RCX);
  }
  else {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,&(this->super_Symbol).name,&local_9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenerateBlockArraySymbol::getExternalName() const {
    if (!name.empty())
        return std::string(name);

    auto parent = getParentScope();
    SLANG_ASSERT(parent);

    return createGenBlkName(constructIndex, *parent);
}